

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void DecodeFunction(w3Module *module,w3Code *code,uint8_t **cursor)

{
  uint32_t uVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  w3Tag value_type;
  w3Tag local_39;
  vector<w3Tag,_std::allocator<w3Tag>_> *local_38;
  
  uVar1 = w3Module::read_varuint32(module,cursor);
  uVar3 = (ulong)uVar1;
  printf("local_type_count:%lX\n",uVar3);
  local_38 = &code->locals;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = w3Module::read_varuint32(module,cursor);
    local_39 = w3Module::read_valuetype(module,cursor);
    printf("local_type_count %lX-of-%lX count:%lX type:%X\n",uVar2,uVar3,(ulong)uVar1,
           (ulong)local_39);
    std::vector<w3Tag,_std::allocator<w3Tag>_>::resize
              (local_38,(size_type)
                        ((code->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                        ((ulong)uVar1 -
                        (long)(code->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>.
                              _M_impl.super__Vector_impl_data._M_start)),&local_39);
  }
  DecodeInstructions(module,&code->decoded_instructions,cursor,code);
  return;
}

Assistant:

void DecodeFunction (w3Module* module, w3Code* code, uint8_t** cursor)
{
    // read count of types
    // for each type
    //   read type and count for that type
    const size_t local_type_count = module->read_varuint32 (cursor);
    printf ("local_type_count:%" FORMAT_SIZE "X\n", local_type_count);
    for (size_t i = 0; i < local_type_count; ++i)
    {
        const size_t j = module->read_varuint32 (cursor);
        w3Tag value_type = module->read_valuetype (cursor);
        printf ("local_type_count %" FORMAT_SIZE "X-of-%" FORMAT_SIZE "X count:%" FORMAT_SIZE "X type:%X\n", i, local_type_count, j, value_type);
        code->locals.resize (code->locals.size () + j, value_type);
    }
    DecodeInstructions (module, code->decoded_instructions, cursor, code);
}